

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O1

void __thiscall HTTPReplySender::post_done_event(HTTPReplySender *this,int sock_err,char *msg)

{
  TadsHttpReplyResult *this_00;
  
  this_00 = (TadsHttpReplyResult *)operator_new(0x68);
  TadsHttpReplyResult::TadsHttpReplyResult(this_00,this->req,this->reqvar,this->body,sock_err,msg);
  TadsMessageQueue::post(this->queue,(TadsMessage *)this_00);
  this->body = (bodyArg *)0x0;
  this->reqvar = (vm_globalvar_t *)0x0;
  this->req = (TadsHttpRequest *)0x0;
  return;
}

Assistant:

void post_done_event(int sock_err, const char *msg)
    {
        /* establish the global context */
        VMGLOB_PTR(vmg);

        /* create the result event */
        TadsHttpReplyResult *evt = new TadsHttpReplyResult(
            vmg_ req, reqvar, body, sock_err, msg);
        
        /* queue the event (this transfers ownership to the queue) */
        queue->post(evt);

        /* forget the items that the event object took ownership of */
        req = 0;
        body = 0;
        reqvar = 0;
    }